

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O0

void uts_parseParams(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *local_48;
  int local_34;
  int local_20;
  int local_1c;
  int err;
  int i;
  char **argv_local;
  int argc_local;
  
  local_1c = 1;
  local_20 = -1;
  do {
    if (argc <= local_1c || local_20 != -1) {
LAB_00104b15:
      if (local_20 != -1) {
        if (local_1c + 1 < argc) {
          local_48 = argv[local_1c + 1];
        }
        else {
          local_48 = "[none]";
        }
        printf("Unrecognized parameter or incorrect/missing value: \'%s %s\'\n",argv[local_1c],
               local_48);
        printf("Try -h for help.\n");
        impl_abort(4);
      }
      return;
    }
    if ((*argv[local_1c] == '-') && (argv[local_1c][1] == 'h')) {
      uts_helpMessage();
      impl_abort(0);
    }
    else if ((*argv[local_1c] != '-') ||
            ((sVar2 = strlen(argv[local_1c]), sVar2 != 2 || (argc <= local_1c + 1)))) {
      local_20 = local_1c;
      goto LAB_00104b15;
    }
    iVar1 = impl_parseParam(argv[local_1c],argv[local_1c + 1]);
    if (iVar1 == 0) {
      local_1c = local_1c + 2;
    }
    else {
      switch(argv[local_1c][1]) {
      case 'a':
        shape_fn = atoi(argv[local_1c + 1]);
        if (FIXED < shape_fn) {
          local_20 = local_1c;
        }
        break;
      case 'b':
        b_0 = atof(argv[local_1c + 1]);
        break;
      default:
        local_20 = local_1c;
        break;
      case 'd':
        gen_mx = atoi(argv[local_1c + 1]);
        break;
      case 'f':
        shiftDepth = atof(argv[local_1c + 1]);
        break;
      case 'g':
        iVar1 = atoi(argv[local_1c + 1]);
        if (iVar1 < 1) {
          local_34 = 1;
        }
        else {
          local_34 = atoi(argv[local_1c + 1]);
        }
        computeGranularity = local_34;
        break;
      case 'm':
        nonLeafBF = atoi(argv[local_1c + 1]);
        break;
      case 'q':
        nonLeafProb = atof(argv[local_1c + 1]);
        break;
      case 'r':
        rootId = atoi(argv[local_1c + 1]);
        break;
      case 't':
        type = atoi(argv[local_1c + 1]);
        if ((((type != BIN) && (type != GEO)) && (type != HYBRID)) && (type != BALANCED)) {
          local_20 = local_1c;
        }
        break;
      case 'v':
        verbose = atoi(argv[local_1c + 1]);
        break;
      case 'x':
        debug = atoi(argv[local_1c + 1]);
      }
      if (local_20 != -1) goto LAB_00104b15;
      local_1c = local_1c + 2;
    }
  } while( true );
}

Assistant:

void uts_parseParams(int argc, char *argv[]){
  int i = 1; 
  int err = -1;
  while (i < argc && err == -1) {
    if (argv[i][0] == '-' && argv[i][1] == 'h') {
        uts_helpMessage();
        impl_abort(0);

    } else if (argv[i][0] != '-' || strlen(argv[i]) != 2 || argc <= i+1) {
      err = i; break;
    }

    // Matched by implementation -- return 0 on success
    // This is fragile, don't override parameters in impl_parseParam()!
    if (!impl_parseParam(argv[i], argv[i+1])) {
      i += 2;
      continue;
    }

    switch (argv[i][1]) {
      case 'q':
        nonLeafProb = atof(argv[i+1]); break;
      case 'm':
        nonLeafBF = atoi(argv[i+1]); break;
      case 'r':
        rootId = atoi(argv[i+1]); break;
      case 'x':
        debug = atoi(argv[i+1]); break;
      case 'v':
        verbose = atoi(argv[i+1]); break;
      case 't':
        type = (tree_t) atoi(argv[i+1]); 
        if (type != BIN && type != GEO && type!= HYBRID && type != BALANCED) 
	  err = i;
        break;
      case 'a':
        shape_fn = (geoshape_t) atoi(argv[i+1]);
        if (shape_fn > FIXED) err = i;
        break;
      case 'b':
        b_0 = atof(argv[i+1]); break;
      case 'd':
        gen_mx = atoi(argv[i+1]); break;
      case 'f':
        shiftDepth = atof(argv[i+1]); break;
      case 'g':
        computeGranularity = max(1,atoi(argv[i+1])); break;
      default:
        err = i;
    }

    if (err != -1) break;

    i += 2;
  }

  if (err != -1) {
    printf("Unrecognized parameter or incorrect/missing value: '%s %s'\n", argv[i], (i+1 < argc) ? argv[i+1] : "[none]");
    printf("Try -h for help.\n");
    impl_abort(4);
  }
}